

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O2

void __thiscall SamplerTest_size_of_class_Test::TestBody(SamplerTest_size_of_class_Test *this)

{
  ostream *poVar1;
  undefined1 auStack_38 [8];
  Sampler sampler;
  
  auStack_38 = (undefined1  [8])0x0;
  sampler.bytes_until_sample_ = 0;
  sampler.rnd_._0_1_ = 0;
  tcmalloc::Sampler::Init((Sampler *)auStack_38,1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  poVar1 = std::operator<<(poVar1,"Size of Sampler class is: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  poVar1 = std::operator<<(poVar1,"Size of Sampler object is: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return;
}

Assistant:

TEST_F(SamplerTest, size_of_class) {
  tcmalloc::Sampler sampler;
  sampler.Init(1);
  LOG(INFO) << "Size of Sampler class is: " << sizeof(tcmalloc::Sampler);
  LOG(INFO) << "Size of Sampler object is: " << sizeof(sampler);
}